

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O2

string * __thiscall
cppcms::http::protocol::unquote<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,protocol *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 end)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  
  p_Var2 = *(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             **)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((p_Var2 < begin) && (*(char *)&p_Var2->_M_current == '\"')) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    p_Var2 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&p_Var2->_M_current + 1);
    while (p_Var2 < begin) {
      p_Var1 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&p_Var2->_M_current + 1);
      if (*(char *)&p_Var2->_M_current == '\\') {
        if (begin <= p_Var1) goto LAB_0020229f;
        p_Var2 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&p_Var2->_M_current + 2);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (*(char *)&p_Var2->_M_current == '\"') {
          *(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            **)this = p_Var1;
          return __return_storage_ptr__;
        }
LAB_0020229f:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        p_Var2 = p_Var1;
      }
    }
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(It &begin,It end)
	{
		It p=begin;
		std::string result;
		if(p>=end || *p!='\"')
			return result;
		result.reserve(end-p);
		p++;
		while(p < end) {
			char c=*p++;
			if(c=='\"') {
				begin=p;
				return result;
			}
			else if(c=='\\' && p<end)
				result+= *p++;
			else
				result+=c;
		}
		result.clear();
		return result;
	}